

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
::mapbase_evaluator(mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *this,XprType *map)

{
  Scalar *pSVar1;
  Index value;
  variable_if_dynamic<long,_1> *this_00;
  BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
  *in_RSI;
  undefined8 *in_RDI;
  undefined8 *v;
  
  evaluator_base<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false>_>
  ::evaluator_base((evaluator_base<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>
                    *)0x168095);
  pSVar1 = MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false>,_0>
           ::data(&in_RSI->
                   super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_0>
                 );
  *in_RDI = pSVar1;
  value = BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false,_true>
          ::innerStride((BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
                         *)0x1680cb);
  variable_if_dynamic<long,_-1>::variable_if_dynamic
            ((variable_if_dynamic<long,__1> *)(in_RDI + 1),value);
  v = in_RDI + 2;
  this_00 = (variable_if_dynamic<long,_1> *)
            BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false,_true>
            ::outerStride(in_RSI);
  variable_if_dynamic<long,_1>::variable_if_dynamic(this_00,(long)v);
  return;
}

Assistant:

mapbase_evaluator(const XprType& map)
    : m_data(const_cast<PointerType>(map.data())),
      m_innerStride(map.innerStride()),
      m_outerStride(map.outerStride())
  {
    EIGEN_STATIC_ASSERT(EIGEN_IMPLIES(evaluator<Derived>::Flags&PacketAccessBit, internal::inner_stride_at_compile_time<Derived>::ret==1),
                        PACKET_ACCESS_REQUIRES_TO_HAVE_INNER_STRIDE_FIXED_TO_1);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }